

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.h
# Opt level: O0

void GEN_CS::gen_cs_label<false>(cb_to_cs *c,example *ec,label *cs_ld,uint32_t action)

{
  int in_ECX;
  long in_RDI;
  float fVar1;
  wclass wc;
  undefined4 in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  
  fVar1 = CB_ALGS::get_cost_pred<false>
                    ((single_learner *)c,(cb_class *)ec,(example *)cs_ld,action,
                     (uint32_t)wc.wap_value);
  v_array<COST_SENSITIVE::wclass>::push_back
            ((v_array<COST_SENSITIVE::wclass> *)CONCAT44(fVar1,in_stack_ffffffffffffffd0),
             (wclass *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if ((*(long *)(in_RDI + 0x50) != 0) && (*(int *)(*(long *)(in_RDI + 0x50) + 4) == in_ECX)) {
    *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 1;
    in_stack_ffffffffffffffcc = (float)(long)*(ulong *)(in_RDI + 0x40);
    in_stack_ffffffffffffffd0 = (float)*(ulong *)(in_RDI + 0x40);
    *(float *)(in_RDI + 0x38) =
         (1.0 / in_stack_ffffffffffffffd0) *
         ((**(float **)(in_RDI + 0x50) - fVar1) * (**(float **)(in_RDI + 0x50) - fVar1) +
         -*(float *)(in_RDI + 0x38)) + *(float *)(in_RDI + 0x38);
    *(float *)(in_RDI + 0x48) = fVar1;
    *(undefined4 *)(in_RDI + 0x4c) = **(undefined4 **)(in_RDI + 0x50);
    fVar1 = (**(float **)(in_RDI + 0x50) - fVar1) / *(float *)(*(long *)(in_RDI + 0x50) + 8) + fVar1
    ;
  }
  v_array<COST_SENSITIVE::wclass>::push_back
            ((v_array<COST_SENSITIVE::wclass> *)CONCAT44(fVar1,in_stack_ffffffffffffffd0),
             (wclass *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

void gen_cs_label(cb_to_cs& c, example& ec, COST_SENSITIVE::label& cs_ld, uint32_t action)
{
  COST_SENSITIVE::wclass wc = {0., action, 0., 0.};

  // get cost prediction for this action
  wc.x = CB_ALGS::get_cost_pred<is_learn>(c.scorer, c.known_cost, ec, action, c.num_actions);

  c.pred_scores.costs.push_back(wc);
  // add correction if we observed cost for this action and regressor is wrong
  if (c.known_cost != nullptr && c.known_cost->action == action)
  {
    c.nb_ex_regressors++;
    c.avg_loss_regressors += (1.0f / c.nb_ex_regressors) *
        ((c.known_cost->cost - wc.x) * (c.known_cost->cost - wc.x) - c.avg_loss_regressors);
    c.last_pred_reg = wc.x;
    c.last_correct_cost = c.known_cost->cost;
    wc.x += (c.known_cost->cost - wc.x) / c.known_cost->probability;
  }

  cs_ld.costs.push_back(wc);
}